

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O2

void __thiscall
pstore::index::
hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
::iterator_base<true>::iterator_base(iterator_base<true> *this,iterator_base<true> *other)

{
  this->db_ = other->db_;
  memcpy(&this->visited_parents_,&other->visited_parents_,0xd8);
  this->index_ = other->index_;
  (this->pos_)._M_t.
  super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
  .super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_*,_false>.
  _M_head_impl = (pair<const_pstore::uint128,_pstore::extent<unsigned_char>_> *)0x0;
  std::
  __uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
  ::reset((__uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
           *)&this->pos_,(pointer)0x0);
  return;
}

Assistant:

iterator_base (iterator_base const & other) noexcept
                        : db_{other.db_}
                        , visited_parents_ (other.visited_parents_)
                        , index_ (other.index_) {
                    pos_.reset ();
                }